

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status_internal.cc
# Opt level: O0

void __thiscall
absl::lts_20250127::status_internal::StatusRep::ForEachPayload
          (StatusRep *this,
          FunctionRef<void_(std::basic_string_view<char,_std::char_traits<char>_>,_const_absl::lts_20250127::Cord_&)>
          visitor)

{
  ValueType<std::allocator<absl::lts_20250127::status_internal::Payload>_> *pVVar1;
  InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
  *this_00;
  size_type sVar2;
  ValueType<std::allocator<absl::lts_20250127::status_internal::Payload>_> *pVVar3;
  basic_string_view<char,_std::char_traits<char>_> args;
  ValueType<std::allocator<absl::lts_20250127::status_internal::Payload>_> *local_98;
  bool local_7d;
  string local_70 [32];
  basic_string_view<char,_std::char_traits<char>_> local_50;
  reference local_40;
  ValueType<std::allocator<absl::lts_20250127::status_internal::Payload>_> *elem;
  size_t index;
  pointer pIStack_28;
  bool in_reverse;
  InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
  *payloads;
  StatusRep *this_local;
  FunctionRef<void_(std::basic_string_view<char,_std::char_traits<char>_>,_const_absl::lts_20250127::Cord_&)>
  visitor_local;
  
  visitor_local.ptr_ = (VoidPtr)visitor.invoker_;
  this_local = (StatusRep *)visitor.ptr_;
  payloads = (InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
              *)this;
  pIStack_28 = std::
               unique_ptr<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>,_std::default_delete<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_>_>
               ::get(&this->payloads_);
  if (pIStack_28 != (pointer)0x0) {
    sVar2 = InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
            ::size(pIStack_28);
    local_7d = 1 < sVar2 && 6 < (ulong)pIStack_28 % 0xd;
    index._7_1_ = local_7d;
    elem = (ValueType<std::allocator<absl::lts_20250127::status_internal::Payload>_> *)0x0;
    while( true ) {
      pVVar1 = elem;
      pVVar3 = (ValueType<std::allocator<absl::lts_20250127::status_internal::Payload>_> *)
               InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
               ::size(pIStack_28);
      this_00 = pIStack_28;
      if (pVVar3 <= pVVar1) break;
      if ((index._7_1_ & 1) == 0) {
        local_98 = elem;
      }
      else {
        sVar2 = InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
                ::size(pIStack_28);
        local_98 = (ValueType<std::allocator<absl::lts_20250127::status_internal::Payload>_> *)
                   ((sVar2 - 1) - (long)elem);
      }
      local_40 = InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
                 ::operator[](this_00,(size_type)local_98);
      std::__cxx11::string::string(local_70,(string *)local_40);
      args = (basic_string_view<char,_std::char_traits<char>_>)
             std::__cxx11::string::operator_cast_to_basic_string_view(local_70);
      local_50 = args;
      FunctionRef<void_(std::basic_string_view<char,_std::char_traits<char>_>,_const_absl::lts_20250127::Cord_&)>
      ::operator()((FunctionRef<void_(std::basic_string_view<char,_std::char_traits<char>_>,_const_absl::lts_20250127::Cord_&)>
                    *)&this_local,args,&local_40->payload);
      std::__cxx11::string::~string(local_70);
      elem = (ValueType<std::allocator<absl::lts_20250127::status_internal::Payload>_> *)
             &(elem->type_url).field_0x1;
    }
  }
  return;
}

Assistant:

void StatusRep::ForEachPayload(
    absl::FunctionRef<void(absl::string_view, const absl::Cord&)> visitor)
    const {
  if (auto* payloads = payloads_.get()) {
    bool in_reverse =
        payloads->size() > 1 && reinterpret_cast<uintptr_t>(payloads) % 13 > 6;

    for (size_t index = 0; index < payloads->size(); ++index) {
      const auto& elem =
          (*payloads)[in_reverse ? payloads->size() - 1 - index : index];

#ifdef NDEBUG
      visitor(elem.type_url, elem.payload);
#else
      // In debug mode invalidate the type url to prevent users from relying on
      // this string lifetime.

      // NOLINTNEXTLINE intentional extra conversion to force temporary.
      visitor(std::string(elem.type_url), elem.payload);
#endif  // NDEBUG
    }
  }
}